

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

bool density_tests::detail::
     PutTestObject<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>,_128UL,_8UL>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *i_rand)

{
  EasyRandom *this;
  int32_t iVar1;
  undefined1 local_130 [8];
  ElementType source;
  runtime_type<> type;
  TestObject<128UL,_8UL> local_98;
  EasyRandom *local_18;
  EasyRandom *i_rand_local;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *queue_local;
  
  local_18 = i_rand;
  i_rand_local = (EasyRandom *)queue;
  iVar1 = EasyRandom::get_bool(i_rand,0.9);
  this = i_rand_local;
  if (iVar1 == 0) {
    source.m_storage._120_8_ = density::runtime_type<>::make<density_tests::TestObject<128ul,8ul>>()
    ;
    TestObject<128UL,_8UL>::TestObject((TestObject<128UL,_8UL> *)local_130);
    density::
    lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
    ::dyn_push_copy((lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
                     *)i_rand_local,(runtime_type *)((long)&source.m_storage + 0x78),
                    (TestObject<128UL,_8UL> *)local_130);
    TestObject<128UL,_8UL>::~TestObject((TestObject<128UL,_8UL> *)local_130);
  }
  else {
    TestObject<128UL,_8UL>::TestObject(&local_98);
    density::
    lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>
    ::push<density_tests::TestObject<128ul,8ul>>
              ((lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>
                *)this,&local_98);
    TestObject<128UL,_8UL>::~TestObject(&local_98);
  }
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom & i_rand)
            {
                if (i_rand.get_bool(.9))
                {
                    queue.push(ElementType());
                }
                else
                {
                    auto        type = QUEUE::runtime_type::template make<ElementType>();
                    ElementType source;
                    queue.dyn_push_copy(type, &source);
                }
                return true;
            }